

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O0

maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> *
__thiscall
pstore::maybe<std::__cxx11::string,void>::operator=
          (maybe<std::__cxx11::string,void> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *other_local;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *this_local;
  
  temp.field_2._8_8_ = other;
  if (((byte)*this & 1) == 0) {
    std::__cxx11::string::string((string *)(this + 8),(string *)other);
    *this = (maybe<std::__cxx11::string,void>)0x1;
  }
  else {
    std::__cxx11::string::string((string *)local_38,(string *)other);
    __lhs = maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            ::value((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                     *)this);
    std::swap<char,std::char_traits<char>,std::allocator<char>>
              (__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    std::__cxx11::string::~string((string *)local_38);
  }
  return (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *)this;
}

Assistant:

maybe & operator= (U && other) noexcept (
            std::is_nothrow_copy_assignable<T>::value && std::is_nothrow_copy_constructible<
                T>::value && std::is_nothrow_move_assignable<T>::value &&
                std::is_nothrow_move_constructible<T>::value) {

            if (valid_) {
                T temp = std::forward<U> (other);
                std::swap (this->value (), temp);
            } else {
                new (&storage_) T (std::forward<U> (other));
                valid_ = true;
            }
            return *this;
        }